

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlsa_digital_filter_coefficients_to_mel_cepstrum.cc
# Opt level: O0

bool __thiscall
sptk::MlsaDigitalFilterCoefficientsToMelCepstrum::Run
          (MlsaDigitalFilterCoefficientsToMelCepstrum *this,
          vector<double,_std::allocator<double>_> *mlsa_digital_filter_coefficients,
          vector<double,_std::allocator<double>_> *mel_cepstrum)

{
  pointer *ppdVar1;
  size_type sVar2;
  const_iterator __first;
  iterator __last;
  const_reference pvVar3;
  reference pvVar4;
  int iVar5;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int m;
  double *c;
  double *b;
  int length;
  int local_5c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  
  iVar5 = *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish + 1;
  if (((((ulong)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start & 1) == 0) ||
      (sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar2 != (long)iVar5)) ||
     (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) {
    return false;
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar2 != (long)iVar5) {
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8._M_current);
  }
  ppdVar1 = &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  if (((double)*ppdVar1 == 0.0) && (!NAN((double)*ppdVar1))) {
    std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    __first = std::vector<double,_std::allocator<double>_>::end(in_RDI);
    __last = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first._M_current,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               __last._M_current,in_stack_ffffffffffffffb8);
    return true;
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
  pvVar4[*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish] =
       pvVar3[*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish];
  iVar5 = *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  while (local_5c = iVar5 + -1, -1 < local_5c) {
    pvVar4[local_5c] =
         (double)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage * pvVar3[iVar5] + pvVar3[local_5c];
    iVar5 = local_5c;
  }
  return true;
}

Assistant:

bool MlsaDigitalFilterCoefficientsToMelCepstrum::Run(
    const std::vector<double>& mlsa_digital_filter_coefficients,
    std::vector<double>* mel_cepstrum) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      mlsa_digital_filter_coefficients.size() !=
          static_cast<std::size_t>(length) ||
      NULL == mel_cepstrum) {
    return false;
  }

  // Prepare memories.
  if (mel_cepstrum->size() != static_cast<std::size_t>(length)) {
    mel_cepstrum->resize(length);
  }

  // There is no need to convert input when alpha is zero.
  if (0.0 == alpha_) {
    std::copy(mlsa_digital_filter_coefficients.begin(),
              mlsa_digital_filter_coefficients.end(), mel_cepstrum->begin());
    return true;
  }

  const double* b(&(mlsa_digital_filter_coefficients[0]));
  double* c(&((*mel_cepstrum)[0]));

  c[num_order_] = b[num_order_];
  for (int m(num_order_ - 1); 0 <= m; --m) {
    c[m] = b[m] + alpha_ * b[m + 1];
  }

  return true;
}